

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_mgau.c
# Opt level: O2

int32 ms_cont_mgau_frame_eval
                (ps_mgau_t *mg,int16 *senscr,uint8 *senone_active,int32 n_senone_active,
                mfcc_t **feat,int32 frame,int32 compallsen)

{
  int32 n_top;
  gauden_t *g;
  senone_t *s;
  short sVar1;
  int32 iVar2;
  ulong uVar3;
  int16 iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  
  n_top = *(int32 *)&mg[2].vt;
  g = (gauden_t *)mg[1].vt;
  s = *(senone_t **)&mg[1].frame_idx;
  if (compallsen == 0) {
    for (lVar10 = 0; lVar10 < g->n_mgau; lVar10 = lVar10 + 1) {
      *(undefined1 *)((long)&(mg[3].vt)->name + lVar10) = 0;
    }
    uVar3 = 0;
    uVar8 = (ulong)(uint)n_senone_active;
    if (n_senone_active < 1) {
      uVar8 = uVar3;
    }
    uVar6 = 0;
    for (; uVar8 != uVar3; uVar3 = uVar3 + 1) {
      uVar6 = (ulong)((int)uVar6 + (uint)senone_active[uVar3]);
      *(undefined1 *)((long)&(mg[3].vt)->name + (ulong)s->mgau[uVar6]) = 1;
    }
    for (lVar10 = 0; lVar10 < g->n_mgau; lVar10 = lVar10 + 1) {
      if (*(char *)((long)&(mg[3].vt)->name + lVar10) != '\0') {
        gauden_dist(g,(int)lVar10,n_top,feat,
                    *(gauden_dist_t ***)(*(long *)&mg[2].frame_idx + lVar10 * 8));
      }
    }
    iVar9 = 0x7fffffff;
    uVar6 = 0;
    for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
      uVar7 = (int)uVar6 + (uint)senone_active[uVar3];
      uVar6 = (ulong)uVar7;
      iVar2 = senone_eval(s,uVar7,*(gauden_dist_t ***)
                                   (*(long *)&mg[2].frame_idx + (ulong)s->mgau[uVar6] * 8),n_top);
      sVar1 = (short)iVar2;
      senscr[uVar6] = sVar1;
      if (sVar1 <= iVar9) {
        iVar9 = (int)sVar1;
      }
    }
    uVar6 = 0;
    for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
      uVar6 = (ulong)((int)uVar6 + (uint)senone_active[uVar3]);
      iVar5 = senscr[uVar6] - iVar9;
      if (0x7ffe < iVar5) {
        iVar5 = 0x7fff;
      }
      if (iVar5 < -0x7fff) {
        iVar5 = -0x8000;
      }
      senscr[uVar6] = (int16)iVar5;
    }
  }
  else {
    for (lVar10 = 0; lVar10 < g->n_mgau; lVar10 = lVar10 + 1) {
      gauden_dist(g,(int)lVar10,n_top,feat,
                  *(gauden_dist_t ***)(*(long *)&mg[2].frame_idx + lVar10 * 8));
    }
    iVar9 = 0x7fffffff;
    for (uVar8 = 0; uVar7 = s->n_sen, uVar8 < uVar7; uVar8 = uVar8 + 1) {
      iVar2 = senone_eval(s,(int)uVar8,
                          *(gauden_dist_t ***)
                           (*(long *)&mg[2].frame_idx + (ulong)s->mgau[uVar8] * 8),n_top);
      sVar1 = (short)iVar2;
      senscr[uVar8] = sVar1;
      if (sVar1 <= iVar9) {
        iVar9 = (int)sVar1;
      }
    }
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      iVar5 = senscr[uVar8] - iVar9;
      if (0x7ffe < iVar5) {
        iVar5 = 0x7fff;
      }
      iVar4 = (int16)iVar5;
      if (iVar5 < -0x7fff) {
        iVar4 = -0x8000;
      }
      senscr[uVar8] = iVar4;
    }
  }
  return 0;
}

Assistant:

int32
ms_cont_mgau_frame_eval(ps_mgau_t * mg,
			int16 *senscr,
			uint8 *senone_active,
			int32 n_senone_active,
                        mfcc_t ** feat,
			int32 frame,
			int32 compallsen)
{
    ms_mgau_model_t *msg = (ms_mgau_model_t *)mg;
    int32 gid;
    int32 topn;
    int32 best;
    gauden_t *g;
    senone_t *sen;

    (void)frame;
    topn = ms_mgau_topn(msg);
    g = ms_mgau_gauden(msg);
    sen = ms_mgau_senone(msg);

    if (compallsen) {
	int32 s;

	for (gid = 0; gid < g->n_mgau; gid++)
	    gauden_dist(g, gid, topn, feat, msg->dist[gid]);

	best = MAX_INT32;
	for (s = 0; (uint32)s < sen->n_sen; s++) {
	    senscr[s] = senone_eval(sen, s, msg->dist[sen->mgau[s]], topn);
	    if (best > senscr[s]) {
		best = senscr[s];
	    }
	}

	/* Normalize senone scores */
	for (s = 0; (uint32)s < sen->n_sen; s++) {
	    int32 bs = senscr[s] - best;
	    if (bs > 32767)
		bs = 32767;
	    if (bs < -32768)
		bs = -32768;
	    senscr[s] = bs;
	}
    }
    else {
	int32 i, n;
	/* Flag all active mixture-gaussian codebooks */
	for (gid = 0; gid < g->n_mgau; gid++)
	    msg->mgau_active[gid] = 0;

	n = 0;
	for (i = 0; i < n_senone_active; i++) {
	    /* senone_active consists of deltas. */
	    int32 s = senone_active[i] + n;
	    msg->mgau_active[sen->mgau[s]] = 1;
	    n = s;
	}

	/* Compute topn gaussian density values (for active codebooks) */
	for (gid = 0; gid < g->n_mgau; gid++) {
	    if (msg->mgau_active[gid])
		gauden_dist(g, gid, topn, feat, msg->dist[gid]);
	}

	best = MAX_INT32;
	n = 0;
	for (i = 0; i < n_senone_active; i++) {
	    int32 s = senone_active[i] + n;
	    senscr[s] = senone_eval(sen, s, msg->dist[sen->mgau[s]], topn);
	    if (best > senscr[s]) {
		best = senscr[s];
	    }
	    n = s;
	}

	/* Normalize senone scores */
	n = 0;
	for (i = 0; i < n_senone_active; i++) {
	    int32 s = senone_active[i] + n;
	    int32 bs = senscr[s] - best;
	    if (bs > 32767)
		bs = 32767;
	    if (bs < -32768)
		bs = -32768;
	    senscr[s] = bs;
	    n = s;
	}
    }

    return 0;
}